

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc.cc
# Opt level: O3

void __thiscall
TCMallocImplementation::Ranges(TCMallocImplementation *this,void *arg,RangeFunction *func)

{
  long lVar1;
  PageID start;
  MallocRange *pMVar2;
  bool bVar3;
  SpinLockHolder local_40;
  SpinLockHolder h;
  
  start = 1;
  h.lock_ = (SpinLock *)arg;
  do {
    local_40.lock_ = (SpinLock *)(tcmalloc::Static::pageheap_ + 8);
    LOCK();
    bVar3 = tcmalloc::Static::pageheap_._8_4_ == 0;
    if (bVar3) {
      tcmalloc::Static::pageheap_._8_4_ = 1;
    }
    UNLOCK();
    if (!bVar3) {
      SpinLock::SlowLock((SpinLock *)(tcmalloc::Static::pageheap_ + 8));
    }
    pMVar2 = (MallocRange *)
             &IterateOverRanges(void*,void(*)(void*,base::MallocRange_const*))::ranges;
    lVar1 = 0;
    do {
      bVar3 = tcmalloc::PageHeap::GetNextRange((PageHeap *)tcmalloc::Static::pageheap_,start,pMVar2)
      ;
      if (!bVar3) {
        SpinLockHolder::~SpinLockHolder(&local_40);
        if (lVar1 == 0) {
          return;
        }
        goto LAB_00111658;
      }
      start = pMVar2->address + pMVar2->length + 0x1fff >> 0xd;
      lVar1 = lVar1 + 1;
      pMVar2 = pMVar2 + 1;
    } while (lVar1 != 0x10);
    SpinLockHolder::~SpinLockHolder(&local_40);
    lVar1 = 0x10;
LAB_00111658:
    pMVar2 = (MallocRange *)
             &IterateOverRanges(void*,void(*)(void*,base::MallocRange_const*))::ranges;
    do {
      (*func)(h.lock_,pMVar2);
      pMVar2 = pMVar2 + 1;
      lVar1 = lVar1 + -1;
    } while (lVar1 != 0);
    if (!bVar3) {
      return;
    }
  } while( true );
}

Assistant:

virtual void Ranges(void* arg, RangeFunction func) {
    IterateOverRanges(arg, func);
  }